

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

void Tim_ManPrintBoxCopy(Tim_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  long lVar6;
  
  if (p != (Tim_Man_t *)0x0) {
    puts("TIMING MANAGER:");
    if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
      uVar2 = p->nCis;
    }
    else {
      uVar2 = Tim_ManBoxOutputFirst(p,0);
    }
    uVar1 = p->nCis;
    uVar3 = Tim_ManPoNum(p);
    if (p->vBoxes == (Vec_Ptr_t *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(uint)p->vBoxes->nSize;
    }
    printf("PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n",(ulong)uVar2,(ulong)uVar1,(ulong)uVar3,
           (ulong)(uint)p->nCos,uVar5);
    if (((p->vBoxes != (Vec_Ptr_t *)0x0) && (0 < p->vBoxes->nSize)) &&
       (pVVar4 = p->vBoxes, 0 < pVVar4->nSize)) {
      lVar6 = 0;
      do {
        printf("%d ",(ulong)*(uint *)((long)pVVar4->pArray[lVar6] + 0x14));
        lVar6 = lVar6 + 1;
        pVVar4 = p->vBoxes;
      } while (lVar6 < pVVar4->nSize);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Tim_ManPrintBoxCopy( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    int i;
    if ( p == NULL )
        return;
    printf( "TIMING MANAGER:\n" );
    printf( "PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), Tim_ManPoNum(p), Tim_ManCoNum(p), Tim_ManBoxNum(p) );

    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
        printf( "%d ", pBox->iCopy );
    printf( "\n" );
}